

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bilinear_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar7;
  long *in_RDI;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  __m512 _v;
  __m512 value2;
  __m512 v1;
  __m512 v0;
  __m512 value1;
  __m512 v11_val;
  __m512 v10_val;
  __m512 v01_val;
  __m512 v00_val;
  float *value_ptr;
  int *offset_ptr;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  int local_bdc;
  int *local_b90;
  undefined8 *local_b40;
  int local_ad4;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  
  lVar4 = in_RSI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  for (local_ad4 = 0; local_ad4 < (int)lVar4; local_ad4 = local_ad4 + 1) {
    lVar7 = *in_RDI + in_RDI[8] * (long)local_ad4 * in_RDI[2];
    local_b40 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_ad4 * in_RSI[2]);
    local_b90 = (int *)*in_RDX;
    for (local_bdc = 0; local_bdc < iVar1 * (int)lVar5; local_bdc = local_bdc + 1) {
      if (*local_b90 < 0) {
        auVar9 = vbroadcastss_avx512f(ZEXT416(0));
        local_680 = auVar9._0_8_;
        uStack_678 = auVar9._8_8_;
        uStack_670 = auVar9._16_8_;
        uStack_668 = auVar9._24_8_;
        uStack_660 = auVar9._32_8_;
        uStack_658 = auVar9._40_8_;
        uStack_650 = auVar9._48_8_;
        uStack_648 = auVar9._56_8_;
        local_f00 = local_680;
        uStack_ef8 = uStack_678;
        uStack_ef0 = uStack_670;
        uStack_ee8 = uStack_668;
        uStack_ee0 = uStack_660;
        uStack_ed8 = uStack_658;
        uStack_ed0 = uStack_650;
        uStack_ec8 = uStack_648;
      }
      else {
        puVar6 = (undefined8 *)(lVar7 + (long)*local_b90 * 4);
        local_f00 = *puVar6;
        uStack_ef8 = puVar6[1];
        uStack_ef0 = puVar6[2];
        uStack_ee8 = puVar6[3];
        uStack_ee0 = puVar6[4];
        uStack_ed8 = puVar6[5];
        uStack_ed0 = puVar6[6];
        uStack_ec8 = puVar6[7];
      }
      if (local_b90[1] < 0) {
        auVar9 = vbroadcastss_avx512f(ZEXT416(0));
        local_700 = auVar9._0_8_;
        uStack_6f8 = auVar9._8_8_;
        uStack_6f0 = auVar9._16_8_;
        uStack_6e8 = auVar9._24_8_;
        uStack_6e0 = auVar9._32_8_;
        uStack_6d8 = auVar9._40_8_;
        uStack_6d0 = auVar9._48_8_;
        uStack_6c8 = auVar9._56_8_;
        local_f40 = local_700;
        uStack_f38 = uStack_6f8;
        uStack_f30 = uStack_6f0;
        uStack_f28 = uStack_6e8;
        uStack_f20 = uStack_6e0;
        uStack_f18 = uStack_6d8;
        uStack_f10 = uStack_6d0;
        uStack_f08 = uStack_6c8;
      }
      else {
        puVar6 = (undefined8 *)(lVar7 + (long)local_b90[1] * 4);
        local_f40 = *puVar6;
        uStack_f38 = puVar6[1];
        uStack_f30 = puVar6[2];
        uStack_f28 = puVar6[3];
        uStack_f20 = puVar6[4];
        uStack_f18 = puVar6[5];
        uStack_f10 = puVar6[6];
        uStack_f08 = puVar6[7];
      }
      if (local_b90[2] < 0) {
        auVar9 = vbroadcastss_avx512f(ZEXT416(0));
        local_780 = auVar9._0_8_;
        uStack_778 = auVar9._8_8_;
        uStack_770 = auVar9._16_8_;
        uStack_768 = auVar9._24_8_;
        uStack_760 = auVar9._32_8_;
        uStack_758 = auVar9._40_8_;
        uStack_750 = auVar9._48_8_;
        uStack_748 = auVar9._56_8_;
        local_f80 = local_780;
        uStack_f78 = uStack_778;
        uStack_f70 = uStack_770;
        uStack_f68 = uStack_768;
        uStack_f60 = uStack_760;
        uStack_f58 = uStack_758;
        uStack_f50 = uStack_750;
        uStack_f48 = uStack_748;
      }
      else {
        puVar6 = (undefined8 *)(lVar7 + (long)local_b90[2] * 4);
        local_f80 = *puVar6;
        uStack_f78 = puVar6[1];
        uStack_f70 = puVar6[2];
        uStack_f68 = puVar6[3];
        uStack_f60 = puVar6[4];
        uStack_f58 = puVar6[5];
        uStack_f50 = puVar6[6];
        uStack_f48 = puVar6[7];
      }
      if (local_b90[3] < 0) {
        auVar9 = vbroadcastss_avx512f(ZEXT416(0));
        local_800 = auVar9._0_8_;
        uStack_7f8 = auVar9._8_8_;
        uStack_7f0 = auVar9._16_8_;
        uStack_7e8 = auVar9._24_8_;
        uStack_7e0 = auVar9._32_8_;
        uStack_7d8 = auVar9._40_8_;
        uStack_7d0 = auVar9._48_8_;
        uStack_7c8 = auVar9._56_8_;
        local_fc0 = local_800;
        uStack_fb8 = uStack_7f8;
        uStack_fb0 = uStack_7f0;
        uStack_fa8 = uStack_7e8;
        uStack_fa0 = uStack_7e0;
        uStack_f98 = uStack_7d8;
        uStack_f90 = uStack_7d0;
        uStack_f88 = uStack_7c8;
      }
      else {
        puVar6 = (undefined8 *)(lVar7 + (long)local_b90[3] * 4);
        local_fc0 = *puVar6;
        uStack_fb8 = puVar6[1];
        uStack_fb0 = puVar6[2];
        uStack_fa8 = puVar6[3];
        uStack_fa0 = puVar6[4];
        uStack_f98 = puVar6[5];
        uStack_f90 = puVar6[6];
        uStack_f88 = puVar6[7];
      }
      auVar8 = vbroadcastss_avx512f(ZEXT416((uint)local_b90[4]));
      auVar3._8_8_ = uStack_ef8;
      auVar3._0_8_ = local_f00;
      auVar3._16_8_ = uStack_ef0;
      auVar3._24_8_ = uStack_ee8;
      auVar3._32_8_ = uStack_ee0;
      auVar3._40_8_ = uStack_ed8;
      auVar3._48_8_ = uStack_ed0;
      auVar3._56_8_ = uStack_ec8;
      auVar2._8_8_ = uStack_ef8;
      auVar2._0_8_ = local_f00;
      auVar2._16_8_ = uStack_ef0;
      auVar2._24_8_ = uStack_ee8;
      auVar2._32_8_ = uStack_ee0;
      auVar2._40_8_ = uStack_ed8;
      auVar2._48_8_ = uStack_ed0;
      auVar2._56_8_ = uStack_ec8;
      auVar9 = vfnmadd213ps_avx512f(auVar8,auVar3,auVar2);
      auVar10._8_8_ = uStack_f38;
      auVar10._0_8_ = local_f40;
      auVar10._16_8_ = uStack_f30;
      auVar10._24_8_ = uStack_f28;
      auVar10._32_8_ = uStack_f20;
      auVar10._40_8_ = uStack_f18;
      auVar10._48_8_ = uStack_f10;
      auVar10._56_8_ = uStack_f08;
      auVar10 = vfmadd213ps_avx512f(auVar8,auVar10,auVar9);
      auVar12._8_8_ = uStack_f78;
      auVar12._0_8_ = local_f80;
      auVar12._16_8_ = uStack_f70;
      auVar12._24_8_ = uStack_f68;
      auVar12._32_8_ = uStack_f60;
      auVar12._40_8_ = uStack_f58;
      auVar12._48_8_ = uStack_f50;
      auVar12._56_8_ = uStack_f48;
      auVar11._8_8_ = uStack_f78;
      auVar11._0_8_ = local_f80;
      auVar11._16_8_ = uStack_f70;
      auVar11._24_8_ = uStack_f68;
      auVar11._32_8_ = uStack_f60;
      auVar11._40_8_ = uStack_f58;
      auVar11._48_8_ = uStack_f50;
      auVar11._56_8_ = uStack_f48;
      auVar11 = vfnmadd213ps_avx512f(auVar8,auVar12,auVar11);
      auVar9._8_8_ = uStack_fb8;
      auVar9._0_8_ = local_fc0;
      auVar9._16_8_ = uStack_fb0;
      auVar9._24_8_ = uStack_fa8;
      auVar9._32_8_ = uStack_fa0;
      auVar9._40_8_ = uStack_f98;
      auVar9._48_8_ = uStack_f90;
      auVar9._56_8_ = uStack_f88;
      auVar9 = vfmadd213ps_avx512f(auVar8,auVar9,auVar11);
      auVar11 = vbroadcastss_avx512f(ZEXT416((uint)local_b90[5]));
      auVar12 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar12 = vpxord_avx512f(auVar11,auVar12);
      auVar10 = vfmadd213ps_avx512f(auVar12,auVar10,auVar10);
      auVar9 = vfmadd213ps_avx512f(auVar11,auVar9,auVar10);
      local_e40 = auVar9._0_8_;
      uStack_e38 = auVar9._8_8_;
      uStack_e30 = auVar9._16_8_;
      uStack_e28 = auVar9._24_8_;
      uStack_e20 = auVar9._32_8_;
      uStack_e18 = auVar9._40_8_;
      uStack_e10 = auVar9._48_8_;
      uStack_e08 = auVar9._56_8_;
      *local_b40 = local_e40;
      local_b40[1] = uStack_e38;
      local_b40[2] = uStack_e30;
      local_b40[3] = uStack_e28;
      local_b40[4] = uStack_e20;
      local_b40[5] = uStack_e18;
      local_b40[6] = uStack_e10;
      local_b40[7] = uStack_e08;
      local_b40 = local_b40 + 8;
      local_b90 = local_b90 + 6;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bilinear_apply_interpolation_p16(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 4;

            __m512 v00_val = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
            __m512 v01_val = offset_ptr[1] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[1]) : _mm512_set1_ps(0);
            __m512 v10_val = offset_ptr[2] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[2]) : _mm512_set1_ps(0);
            __m512 v11_val = offset_ptr[3] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[3]) : _mm512_set1_ps(0);

            __m512 value1 = _mm512_set1_ps(value_ptr[0]);
            __m512 v0 = _mm512_fmadd_ps(v01_val, value1, _mm512_fnmadd_ps(v00_val, value1, v00_val));
            __m512 v1 = _mm512_fmadd_ps(v11_val, value1, _mm512_fnmadd_ps(v10_val, value1, v10_val));

            __m512 value2 = _mm512_set1_ps(value_ptr[1]);
            __m512 _v = _mm512_fmadd_ps(v1, value2, _mm512_fnmadd_ps(v0, value2, v0));
            _mm512_storeu_ps(dstptr, _v);

            dstptr += 16;
            offset_value_ptr += 6;
        }
    }
}